

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O2

void __thiscall soul::Structure::Structure(Structure *this,string *nm,void *backlink)

{
  bool bVar1;
  
  (this->super_RefCountedObject).refCount = 0;
  this->backlinkToASTObject = backlink;
  this->activeUseFlag = false;
  (this->members).items = (Member *)(this->members).space;
  (this->members).numActive = 0;
  (this->members).numAllocated = 8;
  std::__cxx11::string::string((string *)&this->name,(string *)nm);
  (this->memberIndexMap)._M_h._M_buckets = &(this->memberIndexMap)._M_h._M_single_bucket;
  (this->memberIndexMap)._M_h._M_bucket_count = 1;
  (this->memberIndexMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memberIndexMap)._M_h._M_element_count = 0;
  (this->memberIndexMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->memberIndexMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->memberIndexMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar1 = containsChar(&this->name,'#');
  if (!bVar1) {
    return;
  }
  throwInternalCompilerError("! containsChar (name, \'#\')","Structure",0x20);
}

Assistant:

Structure::Structure (std::string nm, void* backlink)
  : backlinkToASTObject (backlink), name (std::move (nm))
{
    SOUL_ASSERT (! containsChar (name, '#'));
}